

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

void __thiscall
cmake::SetArgs(cmake *this,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *args,bool directoriesSetBefore)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  size_type sVar5;
  const_reference pvVar6;
  long lVar7;
  char *pcVar8;
  ulong uVar9;
  ostream *poVar10;
  bool collapse;
  bool collapse_00;
  string local_1c0;
  string local_1a0;
  cmGlobalGenerator *local_180;
  cmGlobalGenerator *gen;
  string value_2;
  string value_1;
  string local_130 [8];
  string value;
  undefined1 local_f0 [8];
  string path_2;
  undefined1 local_b0 [8];
  string path_1;
  undefined1 local_60 [8];
  string path;
  string arg;
  uint i;
  bool havePlatform;
  bool haveToolset;
  bool directoriesSet;
  bool directoriesSetBefore_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmake *this_local;
  
  bVar3 = false;
  bVar1 = false;
  arg.field_2._8_4_ = 1;
  arg.field_2._M_local_buf[0xe] = directoriesSetBefore;
  do {
    sVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(args);
    if (sVar5 <= (uint)arg.field_2._8_4_) {
      if ((arg.field_2._M_local_buf[0xe] & 1U) == 0) {
        cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
                  (&local_1a0,(SystemTools *)0x1,collapse);
        SetHomeOutputDirectory(this,&local_1a0);
        std::__cxx11::string::~string((string *)&local_1a0);
        cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
                  (&local_1c0,(SystemTools *)0x1,collapse_00);
        SetHomeDirectory(this,&local_1c0);
        std::__cxx11::string::~string((string *)&local_1c0);
      }
      return;
    }
    pvVar6 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](args,(ulong)(uint)arg.field_2._8_4_);
    std::__cxx11::string::string((string *)(path.field_2._M_local_buf + 8),(string *)pvVar6);
    lVar7 = std::__cxx11::string::find(path.field_2._M_local_buf + 8,0xa68a4f);
    if (lVar7 == 0) {
      arg.field_2._M_local_buf[0xe] = '\x01';
      std::__cxx11::string::substr((ulong)local_60,(ulong)((long)&path.field_2 + 8));
      cmsys::SystemTools::CollapseFullPath((string *)((long)&path_1.field_2 + 8),(string *)local_60)
      ;
      std::__cxx11::string::operator=
                ((string *)local_60,(string *)(path_1.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(path_1.field_2._M_local_buf + 8));
      cmsys::SystemTools::ConvertToUnixSlashes((string *)local_60);
      SetHomeDirectory(this,(string *)local_60);
      std::__cxx11::string::~string((string *)local_60);
LAB_006cc180:
      bVar2 = false;
    }
    else {
      lVar7 = std::__cxx11::string::find(path.field_2._M_local_buf + 8,0xa4e076);
      if ((lVar7 == 0) ||
         (lVar7 = std::__cxx11::string::find(path.field_2._M_local_buf + 8,0xa4df41), lVar7 == 0))
      goto LAB_006cc180;
      lVar7 = std::__cxx11::string::find(path.field_2._M_local_buf + 8,0xa68a53);
      if (lVar7 == 0) {
        arg.field_2._M_local_buf[0xe] = '\x01';
        std::__cxx11::string::substr((ulong)local_b0,(ulong)((long)&path.field_2 + 8));
        cmsys::SystemTools::CollapseFullPath
                  ((string *)((long)&path_2.field_2 + 8),(string *)local_b0);
        std::__cxx11::string::operator=
                  ((string *)local_b0,(string *)(path_2.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(path_2.field_2._M_local_buf + 8));
        cmsys::SystemTools::ConvertToUnixSlashes((string *)local_b0);
        SetHomeOutputDirectory(this,(string *)local_b0);
        std::__cxx11::string::~string((string *)local_b0);
        goto LAB_006cc180;
      }
      sVar5 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(args);
      if (((ulong)(uint)arg.field_2._8_4_ < sVar5 - 2) &&
         (lVar7 = std::__cxx11::string::find(path.field_2._M_local_buf + 8,0xa65b73), lVar7 == 0)) {
        pvVar6 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](args,(ulong)(arg.field_2._8_4_ + 1));
        std::__cxx11::string::operator=((string *)&this->CheckBuildSystemArgument,(string *)pvVar6);
        arg.field_2._8_4_ = arg.field_2._8_4_ + 2;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](args,(ulong)(uint)arg.field_2._8_4_);
        pcVar8 = (char *)std::__cxx11::string::c_str();
        iVar4 = atoi(pcVar8);
        this->ClearBuildSystem = 0 < iVar4;
        goto LAB_006cc180;
      }
      sVar5 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(args);
      if (((ulong)(uint)arg.field_2._8_4_ < sVar5 - 1) &&
         (lVar7 = std::__cxx11::string::find(path.field_2._M_local_buf + 8,0xa65b88), lVar7 == 0)) {
        arg.field_2._8_4_ = arg.field_2._8_4_ + 1;
        pvVar6 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](args,(ulong)(uint)arg.field_2._8_4_);
        std::__cxx11::string::operator=((string *)&this->CheckStampFile,(string *)pvVar6);
        goto LAB_006cc180;
      }
      sVar5 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(args);
      if (((ulong)(uint)arg.field_2._8_4_ < sVar5 - 1) &&
         (lVar7 = std::__cxx11::string::find(path.field_2._M_local_buf + 8,0xa65b9b), lVar7 == 0)) {
        arg.field_2._8_4_ = arg.field_2._8_4_ + 1;
        pvVar6 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](args,(ulong)(uint)arg.field_2._8_4_);
        std::__cxx11::string::operator=((string *)&this->CheckStampList,(string *)pvVar6);
        goto LAB_006cc180;
      }
      lVar7 = std::__cxx11::string::find(path.field_2._M_local_buf + 8,0xa4df37);
      if (lVar7 == 0) {
        this->Verbose = true;
        goto LAB_006cc180;
      }
      lVar7 = std::__cxx11::string::find(path.field_2._M_local_buf + 8,0xa79646);
      if (((lVar7 == 0) ||
          (lVar7 = std::__cxx11::string::find(path.field_2._M_local_buf + 8,0xa4df9e), lVar7 == 0))
         || (lVar7 = std::__cxx11::string::find(path.field_2._M_local_buf + 8,0xa4df06), lVar7 == 0)
         ) goto LAB_006cc180;
      lVar7 = std::__cxx11::string::find(path.field_2._M_local_buf + 8,0xa5abc1);
      if (lVar7 == 0) {
        arg.field_2._8_4_ = arg.field_2._8_4_ + 1;
        goto LAB_006cc180;
      }
      lVar7 = std::__cxx11::string::find(path.field_2._M_local_buf + 8,0xa65ac5);
      if (lVar7 == 0) {
        arg.field_2._8_4_ = arg.field_2._8_4_ + 1;
        goto LAB_006cc180;
      }
      lVar7 = std::__cxx11::string::find(path.field_2._M_local_buf + 8,0xa65a34);
      if ((lVar7 == 0) ||
         (lVar7 = std::__cxx11::string::find(path.field_2._M_local_buf + 8,0xa65a3d), lVar7 == 0))
      goto LAB_006cc180;
      lVar7 = std::__cxx11::string::find(path.field_2._M_local_buf + 8,0xa65bae);
      if (lVar7 == 0) {
        std::__cxx11::string::substr((ulong)local_f0,(ulong)((long)&path.field_2 + 8));
        cmsys::SystemTools::CollapseFullPath
                  ((string *)((long)&value.field_2 + 8),(string *)local_f0);
        std::__cxx11::string::operator=
                  ((string *)local_f0,(string *)(value.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(value.field_2._M_local_buf + 8));
        cmsys::SystemTools::ConvertToUnixSlashes((string *)local_f0);
        std::__cxx11::string::operator=((string *)&this->GraphVizFile,(string *)local_f0);
        uVar9 = std::__cxx11::string::empty();
        if ((uVar9 & 1) != 0) {
          cmSystemTools::Error
                    ("No file specified for --graphviz",(char *)0x0,(char *)0x0,(char *)0x0);
        }
        std::__cxx11::string::~string((string *)local_f0);
        goto LAB_006cc180;
      }
      lVar7 = std::__cxx11::string::find(path.field_2._M_local_buf + 8,0xa65bdb);
      if (lVar7 == 0) {
        std::operator<<((ostream *)&std::cout,"debug trycompile on\n");
        DebugTryCompileOn(this);
        goto LAB_006cc180;
      }
      lVar7 = std::__cxx11::string::find(path.field_2._M_local_buf + 8,0xa65c03);
      if (lVar7 == 0) {
        std::operator<<((ostream *)&std::cout,"Running with debug output on.\n");
        SetDebugOutputOn(this,true);
        goto LAB_006cc180;
      }
      lVar7 = std::__cxx11::string::find(path.field_2._M_local_buf + 8,0xa65c31);
      if (lVar7 == 0) {
        std::operator<<((ostream *)&std::cout,"Running with trace output on.\n");
        SetTrace(this,true);
        goto LAB_006cc180;
      }
      lVar7 = std::__cxx11::string::find(path.field_2._M_local_buf + 8,0xa65c58);
      if (lVar7 == 0) {
        std::operator<<((ostream *)&std::cout,"Warn about uninitialized values.\n");
        SetWarnUninitialized(this,true);
        goto LAB_006cc180;
      }
      lVar7 = std::__cxx11::string::find(path.field_2._M_local_buf + 8,0xa65c8f);
      if (lVar7 == 0) {
        std::operator<<((ostream *)&std::cout,"Finding unused variables.\n");
        SetWarnUnused(this,true);
        goto LAB_006cc180;
      }
      lVar7 = std::__cxx11::string::find(path.field_2._M_local_buf + 8,0xa65cbd);
      if (lVar7 == 0) {
        poVar10 = std::operator<<((ostream *)&std::cout,
                                  "Not searching for unused variables given on the ");
        std::operator<<(poVar10,"command line.\n");
        SetWarnUnusedCli(this,false);
        goto LAB_006cc180;
      }
      lVar7 = std::__cxx11::string::find(path.field_2._M_local_buf + 8,0xa65d12);
      if (lVar7 == 0) {
        poVar10 = std::operator<<((ostream *)&std::cout,
                                  "Also check system files when warning about unused and ");
        std::operator<<(poVar10,"uninitialized variables.\n");
        SetCheckSystemVars(this,true);
        goto LAB_006cc180;
      }
      lVar7 = std::__cxx11::string::find(path.field_2._M_local_buf + 8,0xa65d91);
      if (lVar7 == 0) {
        std::__cxx11::string::substr((ulong)local_130,(ulong)((long)&path.field_2 + 8));
        uVar9 = std::__cxx11::string::empty();
        if ((uVar9 & 1) == 0) {
LAB_006cbdd4:
          if (bVar1) {
            cmSystemTools::Error
                      ("Multiple -A options not allowed",(char *)0x0,(char *)0x0,(char *)0x0);
            bVar2 = true;
          }
          else {
            std::__cxx11::string::operator=((string *)&this->GeneratorPlatform,local_130);
            bVar1 = true;
            bVar2 = false;
          }
        }
        else {
          arg.field_2._8_4_ = arg.field_2._8_4_ + 1;
          sVar5 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(args);
          if ((uint)arg.field_2._8_4_ < sVar5) {
            pvVar6 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](args,(ulong)(uint)arg.field_2._8_4_);
            std::__cxx11::string::operator=(local_130,(string *)pvVar6);
            goto LAB_006cbdd4;
          }
          cmSystemTools::Error("No platform specified for -A",(char *)0x0,(char *)0x0,(char *)0x0);
          bVar2 = true;
        }
        std::__cxx11::string::~string(local_130);
      }
      else {
        lVar7 = std::__cxx11::string::find(path.field_2._M_local_buf + 8,0xa65dcd);
        if (lVar7 == 0) {
          std::__cxx11::string::substr
                    ((ulong)((long)&value_2.field_2 + 8),(ulong)((long)&path.field_2 + 8));
          uVar9 = std::__cxx11::string::empty();
          if ((uVar9 & 1) == 0) {
LAB_006cbf27:
            if (bVar3) {
              cmSystemTools::Error
                        ("Multiple -T options not allowed",(char *)0x0,(char *)0x0,(char *)0x0);
              bVar2 = true;
            }
            else {
              std::__cxx11::string::operator=
                        ((string *)&this->GeneratorToolset,
                         (string *)(value_2.field_2._M_local_buf + 8));
              bVar3 = true;
              bVar2 = false;
            }
          }
          else {
            arg.field_2._8_4_ = arg.field_2._8_4_ + 1;
            sVar5 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size(args);
            if ((uint)arg.field_2._8_4_ < sVar5) {
              pvVar6 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[](args,(ulong)(uint)arg.field_2._8_4_);
              std::__cxx11::string::operator=
                        ((string *)(value_2.field_2._M_local_buf + 8),(string *)pvVar6);
              goto LAB_006cbf27;
            }
            cmSystemTools::Error("No toolset specified for -T",(char *)0x0,(char *)0x0,(char *)0x0);
            bVar2 = true;
          }
          std::__cxx11::string::~string((string *)(value_2.field_2._M_local_buf + 8));
        }
        else {
          lVar7 = std::__cxx11::string::find(path.field_2._M_local_buf + 8,0xa65e0b);
          if (lVar7 != 0) {
            arg.field_2._M_local_buf[0xe] = '\x01';
            pcVar8 = (char *)std::__cxx11::string::c_str();
            SetDirectoriesFromFile(this,pcVar8);
            goto LAB_006cc180;
          }
          std::__cxx11::string::substr((ulong)&gen,(ulong)((long)&path.field_2 + 8));
          uVar9 = std::__cxx11::string::empty();
          if ((uVar9 & 1) == 0) {
LAB_006cc08b:
            local_180 = CreateGlobalGenerator(this,(string *)&gen);
            if (local_180 == (cmGlobalGenerator *)0x0) {
              pcVar8 = (char *)std::__cxx11::string::c_str();
              cmSystemTools::Error
                        ("Could not create named generator ",pcVar8,(char *)0x0,(char *)0x0);
              PrintGeneratorList(this);
            }
            else {
              SetGlobalGenerator(this,local_180);
            }
            bVar2 = false;
          }
          else {
            arg.field_2._8_4_ = arg.field_2._8_4_ + 1;
            sVar5 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size(args);
            if ((uint)arg.field_2._8_4_ < sVar5) {
              pvVar6 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[](args,(ulong)(uint)arg.field_2._8_4_);
              std::__cxx11::string::operator=((string *)&gen,(string *)pvVar6);
              goto LAB_006cc08b;
            }
            cmSystemTools::Error
                      ("No generator specified for -G",(char *)0x0,(char *)0x0,(char *)0x0);
            PrintGeneratorList(this);
            bVar2 = true;
          }
          std::__cxx11::string::~string((string *)&gen);
        }
      }
      if (!bVar2) goto LAB_006cc180;
    }
    std::__cxx11::string::~string((string *)(path.field_2._M_local_buf + 8));
    if (bVar2) {
      return;
    }
    arg.field_2._8_4_ = arg.field_2._8_4_ + 1;
  } while( true );
}

Assistant:

void cmake::SetArgs(const std::vector<std::string>& args,
                    bool directoriesSetBefore)
{
  bool directoriesSet = directoriesSetBefore;
  bool haveToolset = false;
  bool havePlatform = false;
  for(unsigned int i=1; i < args.size(); ++i)
    {
    std::string arg = args[i];
    if(arg.find("-H",0) == 0)
      {
      directoriesSet = true;
      std::string path = arg.substr(2);
      path = cmSystemTools::CollapseFullPath(path);
      cmSystemTools::ConvertToUnixSlashes(path);
      this->SetHomeDirectory(path);
      }
    else if(arg.find("-S",0) == 0)
      {
      // There is no local generate anymore.  Ignore -S option.
      }
    else if(arg.find("-O",0) == 0)
      {
      // There is no local generate anymore.  Ignore -O option.
      }
    else if(arg.find("-B",0) == 0)
      {
      directoriesSet = true;
      std::string path = arg.substr(2);
      path = cmSystemTools::CollapseFullPath(path);
      cmSystemTools::ConvertToUnixSlashes(path);
      this->SetHomeOutputDirectory(path);
      }
    else if((i < args.size()-2) && (arg.find("--check-build-system",0) == 0))
      {
      this->CheckBuildSystemArgument = args[++i];
      this->ClearBuildSystem = (atoi(args[++i].c_str()) > 0);
      }
    else if((i < args.size()-1) && (arg.find("--check-stamp-file",0) == 0))
      {
      this->CheckStampFile = args[++i];
      }
    else if((i < args.size()-1) && (arg.find("--check-stamp-list",0) == 0))
      {
      this->CheckStampList = args[++i];
      }
#if defined(CMAKE_HAVE_VS_GENERATORS)
    else if((i < args.size()-1) && (arg.find("--vs-solution-file",0) == 0))
      {
      this->VSSolutionFile = args[++i];
      }
#endif
    else if(arg.find("-V",0) == 0)
      {
        this->Verbose = true;
      }
    else if(arg.find("-D",0) == 0)
      {
      // skip for now
      }
    else if(arg.find("-U",0) == 0)
      {
      // skip for now
      }
    else if(arg.find("-C",0) == 0)
      {
      // skip for now
      }
    else if(arg.find("-P",0) == 0)
      {
      // skip for now
      i++;
      }
    else if(arg.find("--find-package",0) == 0)
      {
      // skip for now
      i++;
      }
    else if(arg.find("-Wno-dev",0) == 0)
      {
      // skip for now
      }
    else if(arg.find("-Wdev",0) == 0)
      {
      // skip for now
      }
    else if(arg.find("--graphviz=",0) == 0)
      {
      std::string path = arg.substr(strlen("--graphviz="));
      path = cmSystemTools::CollapseFullPath(path);
      cmSystemTools::ConvertToUnixSlashes(path);
      this->GraphVizFile = path;
      if ( this->GraphVizFile.empty() )
        {
        cmSystemTools::Error("No file specified for --graphviz");
        }
      }
    else if(arg.find("--debug-trycompile",0) == 0)
      {
      std::cout << "debug trycompile on\n";
      this->DebugTryCompileOn();
      }
    else if(arg.find("--debug-output",0) == 0)
      {
      std::cout << "Running with debug output on.\n";
      this->SetDebugOutputOn(true);
      }
    else if(arg.find("--trace",0) == 0)
      {
      std::cout << "Running with trace output on.\n";
      this->SetTrace(true);
      }
    else if(arg.find("--warn-uninitialized",0) == 0)
      {
      std::cout << "Warn about uninitialized values.\n";
      this->SetWarnUninitialized(true);
      }
    else if(arg.find("--warn-unused-vars",0) == 0)
      {
      std::cout << "Finding unused variables.\n";
      this->SetWarnUnused(true);
      }
    else if(arg.find("--no-warn-unused-cli",0) == 0)
      {
      std::cout << "Not searching for unused variables given on the " <<
                   "command line.\n";
      this->SetWarnUnusedCli(false);
      }
    else if(arg.find("--check-system-vars",0) == 0)
      {
      std::cout << "Also check system files when warning about unused and " <<
                   "uninitialized variables.\n";
      this->SetCheckSystemVars(true);
      }
    else if(arg.find("-A",0) == 0)
      {
      std::string value = arg.substr(2);
      if(value.empty())
        {
        ++i;
        if(i >= args.size())
          {
          cmSystemTools::Error("No platform specified for -A");
          return;
          }
        value = args[i];
        }
      if(havePlatform)
        {
        cmSystemTools::Error("Multiple -A options not allowed");
        return;
        }
      this->GeneratorPlatform = value;
      havePlatform = true;
      }
    else if(arg.find("-T",0) == 0)
      {
      std::string value = arg.substr(2);
      if(value.empty())
        {
        ++i;
        if(i >= args.size())
          {
          cmSystemTools::Error("No toolset specified for -T");
          return;
          }
        value = args[i];
        }
      if(haveToolset)
        {
        cmSystemTools::Error("Multiple -T options not allowed");
        return;
        }
      this->GeneratorToolset = value;
      haveToolset = true;
      }
    else if(arg.find("-G",0) == 0)
      {
      std::string value = arg.substr(2);
      if(value.empty())
        {
        ++i;
        if(i >= args.size())
          {
          cmSystemTools::Error("No generator specified for -G");
          this->PrintGeneratorList();
          return;
          }
        value = args[i];
        }
      cmGlobalGenerator* gen =
        this->CreateGlobalGenerator(value);
      if(!gen)
        {
        cmSystemTools::Error("Could not create named generator ",
                             value.c_str());
        this->PrintGeneratorList();
        }
      else
        {
        this->SetGlobalGenerator(gen);
        }
      }
    // no option assume it is the path to the source
    else
      {
      directoriesSet = true;
      this->SetDirectoriesFromFile(arg.c_str());
      }
    }